

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

char * path_encode(char *path)

{
  char ch_00;
  int iVar1;
  size_t sVar2;
  int ch;
  int path_len;
  int pos;
  int i;
  char *path_local;
  
  ch = 0;
  sVar2 = strlen(path);
  for (path_len = 0; path_len < (int)sVar2; path_len = path_len + 1) {
    ch_00 = path[path_len];
    iVar1 = valid_path_char(ch_00);
    if (iVar1 == 0) {
      if (0xffc < (uint)ch) break;
      path_encode::temp[ch] = '-';
      iVar1 = ch + 2;
      path_encode::temp[ch + 1] = "0123456789ABCDEF"[(int)((int)ch_00 >> 4 & 0xf)];
      ch = ch + 3;
      path_encode::temp[iVar1] = "0123456789ABCDEF"[(int)((int)ch_00 & 0xf)];
    }
    else {
      if (0xffe < (uint)ch) break;
      path_encode::temp[ch] = ch_00;
      ch = ch + 1;
    }
  }
  path_encode::temp[ch] = '\0';
  return path_encode::temp;
}

Assistant:

static const char *path_encode(const char *path)
{
	static char temp[FILENAME_MAX];
	int i, pos = 0;
	int path_len = (int)strlen(path);
	for (i = 0; i < path_len; ++i) {
		int ch = path[i];
		if (valid_path_char(ch)) {
			if (pos >= sizeof(temp) - 1)
				break;

			temp[pos++] = (char)ch;
		} else {
			if (pos >= sizeof(temp) - 3)
				break;

			temp[pos++] = '-';
			temp[pos++] = "0123456789ABCDEF"[(ch >> 4) & 0xF];
			temp[pos++] = "0123456789ABCDEF"[ch & 0xF];
		}
	}

	temp[pos] = '\0';
	return temp;
}